

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCountedObjectImpl.hpp
# Opt level: O0

void __thiscall
Diligent::RefCountersImpl::
ObjectWrapper<Diligent::Texture3D_GL,_Diligent::FixedBlockMemoryAllocator>::DestroyObject
          (ObjectWrapper<Diligent::Texture3D_GL,_Diligent::FixedBlockMemoryAllocator> *this)

{
  RefCountedObject<Diligent::ITextureGL> *this_00;
  void *in_RSI;
  ObjectWrapper<Diligent::Texture3D_GL,_Diligent::FixedBlockMemoryAllocator> *this_local;
  
  if (this->m_pAllocator == (FixedBlockMemoryAllocator *)0x0) {
    this_00 = (RefCountedObject<Diligent::ITextureGL> *)this->m_pObject;
    if (this_00 != (RefCountedObject<Diligent::ITextureGL> *)0x0) {
      Texture3D_GL::~Texture3D_GL((Texture3D_GL *)this_00);
      RefCountedObject<Diligent::ITextureGL>::operator_delete(this_00,in_RSI);
    }
  }
  else {
    Texture3D_GL::~Texture3D_GL(this->m_pObject);
    FixedBlockMemoryAllocator::Free(this->m_pAllocator,this->m_pObject);
  }
  return;
}

Assistant:

virtual void DestroyObject() override final
        {
            if (m_pAllocator)
            {
                m_pObject->~ObjectType();
                m_pAllocator->Free(m_pObject);
            }
            else
            {
                delete m_pObject;
            }
        }